

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_defines.hpp
# Opt level: O2

type_conflict4 *
chaiscript::parse_num<long_double>(type_conflict4 *__return_storage_ptr__,string_view t_str)

{
  char cVar1;
  float fVar2;
  type_conflict4 *ptVar3;
  int iVar4;
  
  ptVar3 = (type_conflict4 *)0x0;
  iVar4 = 0;
  fVar2 = 0.0;
  do {
    if (__return_storage_ptr__ == ptVar3) {
      if (iVar4 != 0) {
        ptVar3 = (type_conflict4 *)powl();
      }
      return ptVar3;
    }
    cVar1 = *(char *)(t_str._M_len + (long)ptVar3);
    switch(cVar1) {
    case '-':
      iVar4 = -1;
    case '/':
    case ':':
    case ';':
    case '<':
    case '=':
    case '>':
    case '?':
    case '@':
    case 'A':
    case 'B':
    case 'C':
    case 'D':
switchD_0054ad49_caseD_2f:
      break;
    case '.':
      fVar2 = 10.0;
      break;
    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9':
      if (fVar2 < 10.0) goto switchD_0054ad49_caseD_2f;
      fVar2 = fVar2 * 10.0;
      break;
    case 'E':
switchD_0054ad49_caseD_45:
      iVar4 = 1;
      fVar2 = 0.0;
      break;
    default:
      if (cVar1 == 'e') goto switchD_0054ad49_caseD_45;
      goto switchD_0054ad49_caseD_2f;
    }
    ptVar3 = (type_conflict4 *)((long)ptVar3 + 1);
  } while( true );
}

Assistant:

[[nodiscard]] auto parse_num(const std::string_view t_str) -> typename std::enable_if<!std::is_integral<T>::value, T>::type {
    T t = 0;
    T base{};
    T decimal_place = 0;
    int exponent = 0;

    for (const auto c : t_str) {
      switch (c) {
        case '.':
          decimal_place = 10;
          break;
        case 'e':
        case 'E':
          exponent = 1;
          decimal_place = 0;
          base = t;
          t = 0;
          break;
        case '-':
          exponent = -1;
          break;
        case '+':
          break;
        case '0':
        case '1':
        case '2':
        case '3':
        case '4':
        case '5':
        case '6':
        case '7':
        case '8':
        case '9':
          if (decimal_place < 10) {
            t *= 10;
            t += static_cast<T>(c - '0');
          } else {
            t += static_cast<T>(c - '0') / decimal_place;
            decimal_place *= 10;
          }
          break;
        default:
          break;
      }
    }
    return exponent ? base * std::pow(T(10), t * static_cast<T>(exponent)) : t;
  }